

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ConvolutionReverb.cpp
# Opt level: O1

int ConvolutionReverb::CreateCallback(UnityAudioEffectState *state)

{
  EffectData *data;
  Mutex *this;
  
  data = (EffectData *)operator_new(0x90);
  memset(data,0,0x90);
  this = (Mutex *)operator_new(0x28);
  Mutex::Mutex(this);
  data->mutex = this;
  (state->field_0).field_0.effectdata = data;
  InitParametersFromDefinitions(InternalRegisterEffectDefinition,data->p);
  SetupImpulse(data,2,0x400,(state->field_0).field_0.samplerate);
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK CreateCallback(UnityAudioEffectState* state)
    {
        EffectData* data = new EffectData;
        memset(data, 0, sizeof(EffectData));
        data->mutex = new Mutex();
        state->effectdata = data;
        InitParametersFromDefinitions(InternalRegisterEffectDefinition, data->p);
        SetupImpulse(data, 2, 1024, state->samplerate); // Assuming stereo and 1024 sample block size
        return UNITY_AUDIODSP_OK;
    }